

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O3

Vec_Ptr_t * findDisjunctiveMonotoneSignals(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  aigPoIndices *aigPoIndicesArg;
  antecedentConsequentVectorsStruct *anteConseVectors;
  Aig_Man_t *pAig;
  Vec_Ptr_t *candVec;
  Vec_Int_t *pVVar4;
  void **ppvVar5;
  Vec_Ptr_t *masterVec;
  Vec_Ptr_t *candVec_00;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  iVar2 = findPendingSignal(pNtk);
  if (iVar2 == -1) {
    puts("\nNo Pending Signal Found");
  }
  else {
    pVVar3 = findHintOutputs(pNtk);
    if (pVVar3 != (Vec_Int_t *)0x0) {
      if (0 < (long)pVVar3->nSize) {
        iVar6 = *pVVar3->pArray;
        iVar1 = pVVar3->pArray[(long)pVVar3->nSize + -1];
        aigPoIndicesArg = allocAigPoIndices();
        aigPoIndicesArg->attrPendingSignalIndex = iVar2;
        aigPoIndicesArg->attrHintSingalBeginningMarker = iVar6;
        aigPoIndicesArg->attrHintSingalEndMarker = iVar1;
        iVar2 = collectSafetyInvariantPOIndex(pNtk);
        aigPoIndicesArg->attrSafetyInvarIndex = iVar2;
        anteConseVectors = (antecedentConsequentVectorsStruct *)calloc(1,0x10);
        anteConseVectors->attrConsequentCandidates = pVVar3;
        if (pNtk->ntkType != ABC_NTK_STRASH) {
          pNtk = Abc_NtkStrash(pNtk,0,0,0);
        }
        pAig = Abc_NtkToDar(pNtk,0,1);
        pVVar3 = findNewDisjunctiveMonotone(pAig,aigPoIndicesArg,anteConseVectors);
        candVec = (Vec_Ptr_t *)calloc(1,0x10);
        iVar2 = pVVar3->nSize;
        if ((long)iVar2 < 1) {
          lVar9 = 0;
        }
        else {
          uVar7 = 0;
          lVar8 = 0;
          do {
            pVVar4 = createSingletonIntVector(pVVar3->pArray[lVar8]);
            iVar6 = (int)uVar7;
            if ((int)lVar8 == iVar6) {
              if (iVar6 < 0x10) {
                if (candVec->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc(0x80);
                }
                else {
                  ppvVar5 = (void **)realloc(candVec->pArray,0x80);
                }
                candVec->pArray = ppvVar5;
                candVec->nCap = 0x10;
                uVar7 = 0x10;
              }
              else {
                uVar7 = (ulong)(uint)(iVar6 * 2);
                if (candVec->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc(uVar7 * 8);
                }
                else {
                  ppvVar5 = (void **)realloc(candVec->pArray,uVar7 * 8);
                }
                candVec->pArray = ppvVar5;
                candVec->nCap = iVar6 * 2;
              }
            }
            else {
              ppvVar5 = candVec->pArray;
            }
            lVar9 = lVar8 + 1;
            candVec->nSize = (int)lVar9;
            ppvVar5[lVar8] = pVVar4;
            lVar8 = lVar9;
          } while (iVar2 != lVar9);
        }
        masterVec = (Vec_Ptr_t *)malloc(0x10);
        iVar2 = 8;
        if (6 < (int)lVar9 - 1U) {
          iVar2 = (int)lVar9;
        }
        masterVec->nSize = 0;
        masterVec->nCap = iVar2;
        if (iVar2 == 0) {
          ppvVar5 = (void **)0x0;
        }
        else {
          ppvVar5 = (void **)malloc((long)iVar2 << 3);
        }
        masterVec->pArray = ppvVar5;
        appendVecToMasterVecInt(masterVec,candVec);
        candVec_00 = findNextLevelDisjunctiveMonotone(pAig,aigPoIndicesArg,anteConseVectors,candVec)
        ;
        appendVecToMasterVecInt(masterVec,candVec_00);
        deallocAigPoIndices(aigPoIndicesArg);
        deallocAntecedentConsequentVectorsStruct(anteConseVectors);
        deallocateVecOfIntVec(candVec);
        deallocateVecOfIntVec(candVec_00);
        Aig_ManStop(pAig);
        if (pVVar3->pArray != (int *)0x0) {
          free(pVVar3->pArray);
        }
        free(pVVar3);
        return masterVec;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
  }
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t *findDisjunctiveMonotoneSignals( Abc_Ntk_t *pNtk )
{
	Aig_Man_t *pAig;
	Vec_Int_t *vCandidateMonotoneSignals;
	Vec_Int_t *vKnownMonotoneSignals;
	//Vec_Int_t *vKnownMonotoneSignalsRoundTwo;
	//Vec_Int_t *vOldConsequentVector;
	//Vec_Int_t *vRemainingConsecVector;
	int i;
	int iElem;
	int pendingSignalIndex;
	Abc_Ntk_t *pNtkTemp;
	int hintSingalBeginningMarker;
	int hintSingalEndMarker;
	struct aigPoIndices *aigPoIndicesInstance;
	//struct monotoneVectorsStruct *monotoneVectorsInstance;
	struct antecedentConsequentVectorsStruct *anteConsecInstance;
	//Aig_Obj_t *safetyDriverNew;
	Vec_Int_t *newIntVec;
	Vec_Ptr_t *levelOneMonotne, *levelTwoMonotne;
	//Vec_Ptr_t *levelThreeMonotne;

	Vec_Ptr_t *vMasterDisjunctions;

	extern int findPendingSignal(Abc_Ntk_t *pNtk);
	extern Vec_Int_t *findHintOutputs(Abc_Ntk_t *pNtk);	
	extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );

	//system("rm monotone.dat");
	
	/*******************************************/	
	//Finding the PO index of the pending signal 
	/*******************************************/	
	pendingSignalIndex = findPendingSignal(pNtk);
	if( pendingSignalIndex == -1 )
	{
		printf("\nNo Pending Signal Found\n");
		return NULL;
	}
	//else
		//printf("Po[%d] = %s\n", pendingSignalIndex, Abc_ObjName( Abc_NtkPo(pNtk, pendingSignalIndex) ) );

	/*******************************************/	
	//Finding the PO indices of all hint signals
	/*******************************************/	
	vCandidateMonotoneSignals = findHintOutputs(pNtk);
	if( vCandidateMonotoneSignals == NULL )
		return NULL;
	else
	{
		//Vec_IntForEachEntry( vCandidateMonotoneSignals, iElem, i )
		//	printf("Po[%d] = %s\n", iElem, Abc_ObjName( Abc_NtkPo(pNtk, iElem) ) );
		hintSingalBeginningMarker = Vec_IntEntry( vCandidateMonotoneSignals, 0 );
		hintSingalEndMarker = Vec_IntEntry( vCandidateMonotoneSignals, Vec_IntSize(vCandidateMonotoneSignals) - 1 );
	}

	/**********************************************/
	//Allocating "struct" with necessary parameters
	/**********************************************/
	aigPoIndicesInstance = allocAigPoIndices();
	aigPoIndicesInstance->attrPendingSignalIndex = pendingSignalIndex;
	aigPoIndicesInstance->attrHintSingalBeginningMarker = hintSingalBeginningMarker;
	aigPoIndicesInstance->attrHintSingalEndMarker = hintSingalEndMarker;
	aigPoIndicesInstance->attrSafetyInvarIndex = collectSafetyInvariantPOIndex(pNtk);

	/****************************************************/
	//Allocating "struct" with necessary monotone vectors
	/****************************************************/
	anteConsecInstance = allocAntecedentConsequentVectorsStruct();
	anteConsecInstance->attrAntecedents = NULL;
	anteConsecInstance->attrConsequentCandidates = vCandidateMonotoneSignals;

	/*******************************************/	
	//Generate AIG from Ntk
	/*******************************************/	
	if( !Abc_NtkIsStrash( pNtk ) )
	{
		pNtkTemp = Abc_NtkStrash( pNtk, 0, 0, 0 );
		pAig = Abc_NtkToDar( pNtkTemp, 0, 1 );
	}
	else
	{
		pAig = Abc_NtkToDar( pNtk, 0, 1 );
		pNtkTemp = pNtk;
	}

	/*******************************************/	
	//finding LEVEL 1 monotone signals
	/*******************************************/	
	//printf("Calling target function outside loop\n");
	vKnownMonotoneSignals = findNewDisjunctiveMonotone( pAig, aigPoIndicesInstance, anteConsecInstance );
	levelOneMonotne = Vec_PtrAlloc(0);
	Vec_IntForEachEntry( vKnownMonotoneSignals, iElem, i )
	{
		newIntVec = createSingletonIntVector( iElem );
		Vec_PtrPush( levelOneMonotne, newIntVec );
		//printf("Monotone Po[%d] = %s\n", iElem, Abc_ObjName( Abc_NtkPo(pNtk, iElem) ) );
	}
	//printAllIntVectors( levelOneMonotne, pNtk, "monotone.dat" );

	vMasterDisjunctions = Vec_PtrAlloc( Vec_PtrSize( levelOneMonotne ));
	appendVecToMasterVecInt(vMasterDisjunctions, levelOneMonotne );

	/*******************************************/	
	//finding LEVEL >1 monotone signals
	/*******************************************/	
	#if 0
	if( vKnownMonotoneSignals )
	{
		Vec_IntForEachEntry( vKnownMonotoneSignals, iElem, i )
		{
			printf("\n**************************************************************\n");
			printf("Exploring Second Layer : Reference Po[%d] = %s", iElem, Abc_ObjName( Abc_NtkPo(pNtk, iElem) ));
			printf("\n**************************************************************\n");
			anteConsecInstance->attrAntecedents = createSingletonIntVector( iElem );
			vOldConsequentVector = anteConsecInstance->attrConsequentCandidates;
			vRemainingConsecVector = updateAnteConseVectors(anteConsecInstance);
			if( anteConsecInstance->attrConsequentCandidates != vRemainingConsecVector )
			{
				anteConsecInstance->attrConsequentCandidates = vRemainingConsecVector;
			}
			vKnownMonotoneSignalsRoundTwo = findNewDisjunctiveMonotone( pAig, aigPoIndicesInstance, anteConsecInstance );
			Vec_IntForEachEntry( vKnownMonotoneSignalsRoundTwo, iElemTwo, iTwo )
			{
				printf("Monotone Po[%d] = %s, (%d, %d)\n", iElemTwo, Abc_ObjName( Abc_NtkPo(pNtk, iElemTwo) ), iElem, iElemTwo );
			}
			Vec_IntFree(vKnownMonotoneSignalsRoundTwo);
			Vec_IntFree(anteConsecInstance->attrAntecedents);
			if(anteConsecInstance->attrConsequentCandidates != vOldConsequentVector)
			{
				Vec_IntFree(anteConsecInstance->attrConsequentCandidates);
				anteConsecInstance->attrConsequentCandidates = vOldConsequentVector;
			}
		}
	}
	#endif 

#if 1
	levelTwoMonotne = findNextLevelDisjunctiveMonotone( pAig, aigPoIndicesInstance, anteConsecInstance, levelOneMonotne );
	//printAllIntVectors( levelTwoMonotne, pNtk, "monotone.dat" );
	appendVecToMasterVecInt(vMasterDisjunctions, levelTwoMonotne );
#endif

	//levelThreeMonotne = findNextLevelDisjunctiveMonotone( pAig, aigPoIndicesInstance, anteConsecInstance, levelTwoMonotne );
	//printAllIntVectors( levelThreeMonotne );
	//printAllIntVectors( levelTwoMonotne, pNtk, "monotone.dat" );
	//appendVecToMasterVecInt(vMasterDisjunctions, levelThreeMonotne );

	deallocAigPoIndices(aigPoIndicesInstance);
	deallocAntecedentConsequentVectorsStruct(anteConsecInstance);
	//deallocPointersToMonotoneVectors(monotoneVectorsInstance);

	deallocateVecOfIntVec( levelOneMonotne );
	deallocateVecOfIntVec( levelTwoMonotne );

	Aig_ManStop(pAig);
	Vec_IntFree(vKnownMonotoneSignals);

	return vMasterDisjunctions;
}